

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O1

void __thiscall MT32Emu::RhythmPart::refresh(RhythmPart *this)

{
  Bit8u BVar1;
  long lVar2;
  ulong uVar3;
  bool *pbVar4;
  
  if (((this->super_Part).synth)->controlROMMap->rhythmSettingsCount != 0) {
    pbVar4 = &this->drumCache[0][0].reverb;
    uVar3 = 0;
    do {
      if (this->rhythmTemp[uVar3].timbre < 0x7f) {
        Part::backupCacheToPartials(&this->super_Part,this->drumCache[uVar3]);
        BVar1 = this->rhythmTemp[uVar3].reverbSwitch;
        lVar2 = 0;
        do {
          pbVar4[lVar2 + -9] = true;
          pbVar4[lVar2] = BVar1 != '\0';
          lVar2 = lVar2 + 0x68;
        } while (lVar2 != 0x1a0);
      }
      uVar3 = uVar3 + 1;
      pbVar4 = pbVar4 + 0x1a0;
    } while (uVar3 < ((this->super_Part).synth)->controlROMMap->rhythmSettingsCount);
  }
  (this->super_Part).pitchBenderRange =
       (ushort)(((this->super_Part).patchTemp)->patch).benderRange * 0x2ab;
  return;
}

Assistant:

void RhythmPart::refresh() {
	// (Re-)cache all the mapped timbres ahead of time
	for (unsigned int drumNum = 0; drumNum < synth->controlROMMap->rhythmSettingsCount; drumNum++) {
		int drumTimbreNum = rhythmTemp[drumNum].timbre;
		if (drumTimbreNum >= 127) { // 94 on MT-32
			continue;
		}
		PatchCache *cache = drumCache[drumNum];
		backupCacheToPartials(cache);
		for (int t = 0; t < 4; t++) {
			// Common parameters, stored redundantly
			cache[t].dirty = true;
			cache[t].reverb = rhythmTemp[drumNum].reverbSwitch > 0;
		}
	}
	updatePitchBenderRange();
}